

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

LocalUCPTriePointer __thiscall
icu_63::Normalizer2DataBuilder::processData(Normalizer2DataBuilder *this)

{
  UnicodeString *this_00;
  short sVar1;
  undefined4 srcLength;
  FILE *__stream;
  uint uVar2;
  UChar32 UVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  UErrorCode __status;
  UMutableCPTrie *pUVar7;
  UCPTrie *trie;
  uint8_t *data;
  char *pcVar8;
  undefined8 extraout_RAX;
  int iVar9;
  Normalizer2DataBuilder *in_RSI;
  uint value_00;
  uint uVar10;
  long lVar11;
  UErrorCode *pErrorCode;
  uint32_t value;
  LocalUCPTriePointer *builtTrie;
  IcuToolErrorCode errorCode;
  Decomposer decomposer;
  Norm16Writer norm16Writer;
  CompositionBuilder compBuilder;
  ExtraData extra;
  uint local_424;
  LocalPointerBase<UCPTrie> local_420;
  IcuToolErrorCode local_418;
  UMutableCPTrie *local_400;
  uint local_3f4;
  Enumerator local_3f0;
  char local_3e0;
  Enumerator local_3d8;
  UMutableCPTrie *local_3c0;
  Enumerator local_3b8;
  ExtraData local_3a8;
  
  local_3b8._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003aeec8;
  local_420.ptr = (UCPTrie *)this;
  Norms::enumRanges(&in_RSI->norms,&local_3b8);
  local_3f0._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003aef08;
  do {
    local_3e0 = '\0';
    Norms::enumRanges(&in_RSI->norms,&local_3f0);
  } while (local_3e0 != '\0');
  uVar2 = utm_countItems((in_RSI->norms).normMem);
  if (1 < (int)uVar2) {
    lVar11 = 0x40;
    do {
      postProcess(in_RSI,(Norm *)((long)&((in_RSI->norms).norms)->mapping + lVar11));
      lVar11 = lVar11 + 0x40;
    } while ((ulong)uVar2 << 6 != lVar11);
  }
  ExtraData::ExtraData(&local_3a8,&in_RSI->norms,in_RSI->optimization == OPTIMIZE_FAST);
  Norms::enumRanges(&in_RSI->norms,&local_3a8.super_Enumerator);
  this_00 = &in_RSI->extraData;
  UnicodeString::operator=(this_00,&local_3a8.yesYesCompositions);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[10] = iVar9 * 2;
  if (-1 < local_3a8.yesNoMappingsAndCompositions.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.yesNoMappingsAndCompositions.fUnion.fFields.fLength =
         (int)local_3a8.yesNoMappingsAndCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.yesNoMappingsAndCompositions,0,
             local_3a8.yesNoMappingsAndCompositions.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xe] = iVar9 * 2;
  if (-1 < local_3a8.yesNoMappingsOnly.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.yesNoMappingsOnly.fUnion.fFields.fLength =
         (int)local_3a8.yesNoMappingsOnly.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.yesNoMappingsOnly,0,
             local_3a8.yesNoMappingsOnly.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xb] = iVar9 * 2;
  if (-1 < local_3a8.noNoMappingsCompYes.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompYes.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompYes.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompYes,0,
             local_3a8.noNoMappingsCompYes.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xf] = iVar9 * 2;
  if (-1 < local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompBoundaryBefore,0,
             local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0x10] = iVar9 * 2;
  if (-1 < local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompNoMaybeCC,0,
             local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0x11] = iVar9 * 2;
  if (-1 < local_3a8.noNoMappingsEmpty.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsEmpty.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsEmpty.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsEmpty,0,
             local_3a8.noNoMappingsEmpty.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xc] = iVar9 * 2;
  srcLength = local_3a8.maybeYesCompositions.fUnion.fFields.fLength;
  if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
    srcLength = (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((srcLength & 3) != 0) {
    do {
      local_3d8._vptr_Enumerator =
           (_func_int **)((ulong)local_3d8._vptr_Enumerator & 0xffffffffffff0000);
      UnicodeString::doAppend(&local_3a8.maybeYesCompositions,(UChar *)&local_3d8,0,1);
      srcLength = local_3a8.maybeYesCompositions.fUnion.fFields.fLength;
      if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
        srcLength = (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
    } while ((srcLength & 3) != 0);
  }
  UnicodeString::doReplace(this_00,0,0,&local_3a8.maybeYesCompositions,0,srcLength);
  if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.maybeYesCompositions.fUnion.fFields.fLength =
         (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  in_RSI->indexes[0xd] = local_3a8.maybeYesCompositions.fUnion.fFields.fLength * -2 + 0xfc00;
  uVar2 = *(uint *)&(in_RSI->extraData).fUnion;
  if ((short)uVar2 < 0) {
    uVar2 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    uVar2 = uVar2 >> 5;
  }
  if ((uVar2 & 1) != 0) {
    local_3d8._vptr_Enumerator =
         (_func_int **)((ulong)local_3d8._vptr_Enumerator & 0xffffffffffff0000);
    UnicodeString::doAppend(this_00,(UChar *)&local_3d8,0,1);
  }
  uVar2 = in_RSI->indexes[0xd] - 0x408;
  if ((int)uVar2 < in_RSI->indexes[0xc]) {
    processData();
  }
  else {
    in_RSI->indexes[8] = 0x110000;
    in_RSI->indexes[9] = 0x110000;
    in_RSI->indexes[0x12] = 0x110000;
    local_418.super_ErrorCode.errorCode = U_ZERO_ERROR;
    local_418.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003aef48;
    local_418.location = "gennorm2/processData()";
    pUVar7 = umutablecptrie_open_63(1,1,&local_418.super_ErrorCode.errorCode);
    ErrorCode::assertSuccess(&local_418.super_ErrorCode);
    local_3d8._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003aee10;
    local_3c0 = pUVar7;
    Norms::enumRanges(&in_RSI->norms,&local_3d8);
    setHangulData(in_RSI,pUVar7);
    UVar3 = umutablecptrie_getRange_63
                      (pUVar7,0xd800,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,(void *)0x0,
                       &local_424);
    local_400 = pUVar7;
    local_3f4 = uVar2;
    if ((local_424 == 1) && (0xdffe < UVar3)) {
      uVar2 = 0x10000;
      UVar3 = 0;
      value_00 = 0;
      uVar10 = 0;
      while ((pErrorCode = &local_418.super_ErrorCode.errorCode, (int)uVar2 <= UVar3 ||
             (UVar3 = umutablecptrie_getRange_63
                                (local_400,uVar2,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                 (void *)0x0,&local_424), pUVar7 = local_400, -1 < UVar3))) {
        if (value_00 < local_424) {
          value_00 = local_424;
        }
        if ((uVar2 & 0x3ff) == 0) {
          value_00 = local_424;
        }
        uVar10 = (uVar10 | -(uint)((uVar2 & 0x3ff) == 0)) & local_424;
        if (UVar3 < (int)(uVar2 | 0x3ff)) {
          uVar2 = UVar3 + 1;
        }
        else {
          uVar4 = in_RSI->indexes[0xc];
          if (value_00 < (uint)in_RSI->indexes[0xc]) {
            uVar4 = value_00;
          }
          value_00 = uVar10 & 1 | uVar4 & 0xfffffffe;
          if (value_00 != 1) {
            umutablecptrie_set_63
                      (local_400,(uVar2 >> 10) + 0xd7c0 & 0xffff,value_00,
                       &local_418.super_ErrorCode.errorCode);
          }
          if (local_424 == 1) {
            uVar2 = UVar3 + 1U & 0xfffffc00;
          }
          else {
            uVar2 = (uVar2 | 0x3ff) + 1;
          }
        }
      }
      if (0xffff < in_RSI->indexes[8]) {
        in_RSI->indexes[8] = ((uint)in_RSI->indexes[8] >> 10) + 0xd7c0 & 0xffff;
      }
      if (0xffff < in_RSI->indexes[9]) {
        in_RSI->indexes[9] = ((uint)in_RSI->indexes[9] >> 10) + 0xd7c0 & 0xffff;
      }
      if (0xffff < in_RSI->indexes[0x12]) {
        in_RSI->indexes[0x12] = ((uint)in_RSI->indexes[0x12] >> 10) + 0xd7c0 & 0xffff;
      }
      trie = umutablecptrie_buildImmutable_63
                       (local_400,UCPTRIE_TYPE_FAST,UCPTRIE_VALUE_BITS_16,pErrorCode);
      (((Norms *)&(local_420.ptr)->index)->ccSet).super_UnicodeFilter.super_UnicodeFunctor.
      super_UObject._vptr_UObject = (_func_int **)trie;
      iVar5 = ucptrie_toBinary_63(trie,(void *)0x0,0,pErrorCode);
      in_RSI->norm16TrieLength = iVar5;
      __stream = _stderr;
      if (local_418.super_ErrorCode.errorCode != U_BUFFER_OVERFLOW_ERROR) {
        pcVar8 = ErrorCode::errorName(&local_418.super_ErrorCode);
        fprintf(__stream,"gennorm2 error: unable to build/serialize the normalization trie - %s\n",
                pcVar8);
        __status = ErrorCode::reset(&local_418.super_ErrorCode);
        exit(__status);
      }
      umutablecptrie_close_63(pUVar7);
      ErrorCode::reset(&local_418.super_ErrorCode);
      iVar5 = in_RSI->norm16TrieLength;
      iVar9 = -1;
      if (-1 < iVar5) {
        iVar9 = iVar5;
      }
      data = (uint8_t *)operator_new__((long)iVar9);
      in_RSI->norm16TrieBytes = data;
      ucptrie_toBinary_63((UCPTrie *)
                          (((Norms *)&(local_420.ptr)->index)->ccSet).super_UnicodeFilter.
                          super_UnicodeFunctor.super_UObject._vptr_UObject,data,iVar5,pErrorCode);
      ErrorCode::assertSuccess(&local_418.super_ErrorCode);
      in_RSI->indexes[0] = 0x50;
      iVar9 = in_RSI->norm16TrieLength;
      in_RSI->indexes[1] = iVar9 + 0x50;
      sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (in_RSI->extraData).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      in_RSI->indexes[2] = iVar9 + iVar6 * 2 + 0x50;
      iVar9 = iVar9 + iVar6 * 2 + 0x150;
      lVar11 = 0;
      do {
        in_RSI->indexes[lVar11 + 3] = iVar9;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 5);
      if (beVerbose != '\0') {
        printf("size of normalization trie:         %5ld bytes\n",(long)in_RSI->norm16TrieLength);
        sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (in_RSI->extraData).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        printf("size of 16-bit extra data:          %5ld uint16_t\n",(long)iVar6);
        printf("size of small-FCD data:             %5ld bytes\n",0x100);
        printf("size of binary data file contents:  %5ld bytes\n",(long)iVar9);
        printf("minDecompNoCodePoint:              U+%04lX\n",(long)in_RSI->indexes[8]);
        printf("minCompNoMaybeCodePoint:           U+%04lX\n",(long)in_RSI->indexes[9]);
        printf("minLcccCodePoint:                  U+%04lX\n",(long)in_RSI->indexes[0x12]);
        printf("minYesNo: (with compositions)      0x%04x\n",(ulong)(uint)in_RSI->indexes[10]);
        printf("minYesNoMappingsOnly:              0x%04x\n",(ulong)(uint)in_RSI->indexes[0xe]);
        printf("minNoNo: (comp-normalized)         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xb]);
        printf("minNoNoCompBoundaryBefore:         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xf]);
        printf("minNoNoCompNoMaybeCC:              0x%04x\n",(ulong)(uint)in_RSI->indexes[0x10]);
        printf("minNoNoEmpty:                      0x%04x\n",(ulong)(uint)in_RSI->indexes[0x11]);
        printf("limitNoNo:                         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xc]);
        printf("minNoNoDelta:                      0x%04x\n",(ulong)local_3f4);
        printf("minMaybeYes:                       0x%04x\n",(ulong)(uint)in_RSI->indexes[0xd]);
      }
      if (*(int *)in_RSI->unicodeVersion == 0) {
        u_versionFromString_63(in_RSI->unicodeVersion,"11.0");
      }
      ::dataInfo.dataVersion = *&in_RSI->unicodeVersion;
      Norms::Enumerator::~Enumerator(&local_3d8);
      IcuToolErrorCode::~IcuToolErrorCode(&local_418);
      ExtraData::~ExtraData(&local_3a8);
      Norms::Enumerator::~Enumerator(&local_3f0);
      Norms::Enumerator::~Enumerator(&local_3b8);
      return (LocalUCPTriePointer)(LocalPointerBase<UCPTrie>)local_420.ptr;
    }
  }
  processData();
  LocalUCPTriePointer::~LocalUCPTriePointer((LocalUCPTriePointer *)local_420.ptr);
  Norms::Enumerator::~Enumerator(&local_3d8);
  IcuToolErrorCode::~IcuToolErrorCode(&local_418);
  ExtraData::~ExtraData(&local_3a8);
  Norms::Enumerator::~Enumerator(&local_3f0);
  Norms::Enumerator::~Enumerator(&local_3b8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

LocalUCPTriePointer Normalizer2DataBuilder::processData() {
    // Build composition lists before recursive decomposition,
    // so that we still have the raw, pair-wise mappings.
    CompositionBuilder compBuilder(norms);
    norms.enumRanges(compBuilder);

    // Recursively decompose all mappings.
    Decomposer decomposer(norms);
    do {
        decomposer.didDecompose=FALSE;
        norms.enumRanges(decomposer);
    } while(decomposer.didDecompose);

    // Set the Norm::Type and other properties.
    int32_t normsLength=norms.length();
    for(int32_t i=1; i<normsLength; ++i) {
        postProcess(norms.getNormRefByIndex(i));
    }

    // Write the properties, mappings and composition lists to
    // appropriate parts of the "extra data" array.
    ExtraData extra(norms, optimization==OPTIMIZE_FAST);
    norms.enumRanges(extra);

    extraData=extra.yesYesCompositions;
    indexes[Normalizer2Impl::IX_MIN_YES_NO]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsAndCompositions);
    indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsOnly);
    indexes[Normalizer2Impl::IX_MIN_NO_NO]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompYes);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompBoundaryBefore);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompNoMaybeCC);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]=extraData.length()*2;
    extraData.append(extra.noNoMappingsEmpty);
    indexes[Normalizer2Impl::IX_LIMIT_NO_NO]=extraData.length()*2;

    // Pad the maybeYesCompositions length to a multiple of 4,
    // so that NO_NO_DELTA bits 2..1 can be used without subtracting the center.
    while(extra.maybeYesCompositions.length()&3) {
        extra.maybeYesCompositions.append((UChar)0);
    }
    extraData.insert(0, extra.maybeYesCompositions);
    indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]=
        Normalizer2Impl::MIN_NORMAL_MAYBE_YES-
        extra.maybeYesCompositions.length()*2;

    // Pad to even length for 4-byte alignment of following data.
    if(extraData.length()&1) {
        extraData.append((UChar)0);
    }

    int32_t minNoNoDelta=getMinNoNoDelta();
    U_ASSERT((minNoNoDelta&7)==0);
    if(indexes[Normalizer2Impl::IX_LIMIT_NO_NO]>minNoNoDelta) {
        fprintf(stderr,
                "gennorm2 error: "
                "data structure overflow, too much mapping composition data\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }

    // writeNorm16() and setHangulData() reduce these as needed.
    indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=0x110000;

    IcuToolErrorCode errorCode("gennorm2/processData()");
    UMutableCPTrie *norm16Trie = umutablecptrie_open(
        Normalizer2Impl::INERT, Normalizer2Impl::INERT, errorCode);
    errorCode.assertSuccess();

    // Map each code point to its norm16 value,
    // including the properties that fit directly,
    // and the offset to the "extra data" if necessary.
    Norm16Writer norm16Writer(norm16Trie, norms, *this);
    norms.enumRanges(norm16Writer);
    // TODO: iterate via getRange() instead of callback?

    setHangulData(norm16Trie);

    // Look for the "worst" norm16 value of any supplementary code point
    // corresponding to a lead surrogate, and set it as that surrogate's value.
    // Enables UTF-16 quick check inner loops to look at only code units.
    //
    // We could be more sophisticated:
    // We could collect a bit set for whether there are values in the different
    // norm16 ranges (yesNo, maybeYes, yesYesWithCC etc.)
    // and select the best value that only breaks the composition and/or decomposition
    // inner loops if necessary.
    // However, that seems like overkill for an optimization for supplementary characters.
    //
    // First check that surrogate code *points* are inert.
    // The parser should have rejected values/mappings for them.
    uint32_t value;
    UChar32 end = umutablecptrie_getRange(norm16Trie, 0xd800, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
    if (value != Normalizer2Impl::INERT || end < 0xdfff) {
        fprintf(stderr,
                "gennorm2 error: not all surrogate code points are inert: U+d800..U+%04x=%lx\n",
                (int)end, (long)value);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }
    uint32_t maxNorm16 = 0;
    // ANDing values yields 0 bits where any value has a 0.
    // Used for worst-case HAS_COMP_BOUNDARY_AFTER.
    uint32_t andedNorm16 = 0;
    end = 0;
    for (UChar32 start = 0x10000;;) {
        if (start > end) {
            end = umutablecptrie_getRange(norm16Trie, start, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
            if (end < 0) { break; }
        }
        if ((start & 0x3ff) == 0) {
            // Data for a new lead surrogate.
            maxNorm16 = andedNorm16 = value;
        } else {
            if (value > maxNorm16) {
                maxNorm16 = value;
            }
            andedNorm16 &= value;
        }
        // Intersect each range with the code points for one lead surrogate.
        UChar32 leadEnd = start | 0x3ff;
        if (leadEnd <= end) {
            // End of the supplementary block for a lead surrogate.
            if (maxNorm16 >= (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]) {
                // Set noNo ("worst" value) if it got into "less-bad" maybeYes or ccc!=0.
                // Otherwise it might end up at something like JAMO_VT which stays in
                // the inner decomposition quick check loop.
                maxNorm16 = (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO];
            }
            maxNorm16 =
                (maxNorm16 & ~Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER)|
                (andedNorm16 & Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER);
            if (maxNorm16 != Normalizer2Impl::INERT) {
                umutablecptrie_set(norm16Trie, U16_LEAD(start), maxNorm16, errorCode);
            }
            if (value == Normalizer2Impl::INERT) {
                // Potentially skip inert supplementary blocks for several lead surrogates.
                start = (end + 1) & ~0x3ff;
            } else {
                start = leadEnd + 1;
            }
        } else {
            start = end + 1;
        }
    }

    // Adjust supplementary minimum code points to break quick check loops at their lead surrogates.
    // For an empty data file, minCP=0x110000 turns into 0xdc00 (first trail surrogate)
    // which is harmless.
    // As a result, the minimum code points are always BMP code points.
    int32_t minCP=indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_LCCC_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=U16_LEAD(minCP);
    }

    LocalUCPTriePointer builtTrie(
        umutablecptrie_buildImmutable(norm16Trie, UCPTRIE_TYPE_FAST, UCPTRIE_VALUE_BITS_16, errorCode));
    norm16TrieLength=ucptrie_toBinary(builtTrie.getAlias(), nullptr, 0, errorCode);
    if(errorCode.get()!=U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "gennorm2 error: unable to build/serialize the normalization trie - %s\n",
                errorCode.errorName());
        exit(errorCode.reset());
    }
    umutablecptrie_close(norm16Trie);
    errorCode.reset();
    norm16TrieBytes=new uint8_t[norm16TrieLength];
    ucptrie_toBinary(builtTrie.getAlias(), norm16TrieBytes, norm16TrieLength, errorCode);
    errorCode.assertSuccess();

    int32_t offset=(int32_t)sizeof(indexes);
    indexes[Normalizer2Impl::IX_NORM_TRIE_OFFSET]=offset;
    offset+=norm16TrieLength;
    indexes[Normalizer2Impl::IX_EXTRA_DATA_OFFSET]=offset;
    offset+=extraData.length()*2;
    indexes[Normalizer2Impl::IX_SMALL_FCD_OFFSET]=offset;
    offset+=sizeof(smallFCD);
    int32_t totalSize=offset;
    for(int32_t i=Normalizer2Impl::IX_RESERVED3_OFFSET; i<=Normalizer2Impl::IX_TOTAL_SIZE; ++i) {
        indexes[i]=totalSize;
    }

    if(beVerbose) {
        printf("size of normalization trie:         %5ld bytes\n", (long)norm16TrieLength);
        printf("size of 16-bit extra data:          %5ld uint16_t\n", (long)extraData.length());
        printf("size of small-FCD data:             %5ld bytes\n", (long)sizeof(smallFCD));
        printf("size of binary data file contents:  %5ld bytes\n", (long)totalSize);
        printf("minDecompNoCodePoint:              U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]);
        printf("minCompNoMaybeCodePoint:           U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]);
        printf("minLcccCodePoint:                  U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_LCCC_CP]);
        printf("minYesNo: (with compositions)      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO]);
        printf("minYesNoMappingsOnly:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]);
        printf("minNoNo: (comp-normalized)         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO]);
        printf("minNoNoCompBoundaryBefore:         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]);
        printf("minNoNoCompNoMaybeCC:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]);
        printf("minNoNoEmpty:                      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]);
        printf("limitNoNo:                         0x%04x\n", (int)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]);
        printf("minNoNoDelta:                      0x%04x\n", (int)minNoNoDelta);
        printf("minMaybeYes:                       0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]);
    }

    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    if(0==memcmp(nullVersion, unicodeVersion, 4)) {
        u_versionFromString(unicodeVersion, U_UNICODE_VERSION);
    }
    memcpy(dataInfo.dataVersion, unicodeVersion, 4);
    return builtTrie;
}